

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O0

QEventPoint * __thiscall QTest::QTouchEventSequence::point(QTouchEventSequence *this,int touchId)

{
  bool bVar1;
  QEventPoint *pQVar2;
  undefined4 in_ESI;
  QEventPoint *in_RDI;
  long in_FS_OFFSET;
  QEventPoint *in_stack_ffffffffffffffc8;
  QPointingDevice *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  QMap<int,_QEventPoint> *this_00;
  
  this_00 = *(QMap<int,_QEventPoint> **)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  bVar1 = QMap<int,_QEventPoint>::contains((QMap<int,_QEventPoint> *)in_RDI,(int *)in_RDI);
  if (!bVar1) {
    QEventPoint::QEventPoint(pQVar2,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd0);
    QMap<int,_QEventPoint>::operator[](this_00,(int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    QEventPoint::operator=((QEventPoint *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QEventPoint::~QEventPoint((QEventPoint *)0x4239a7);
  }
  pQVar2 = QMap<int,_QEventPoint>::operator[]
                     (this_00,(int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (*(QMap<int,_QEventPoint> **)(in_FS_OFFSET + 0x28) == this_00) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QEventPoint &QTouchEventSequence::point(int touchId)
{
    if (!points.contains(touchId))
        points[touchId] = QEventPoint(touchId);
    return points[touchId];
}